

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

void Cof_ManCleanValue(Cof_Man_t *p)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  
  iVar1 = p->nObjData;
  if ((0 < iVar1) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    uVar3 = 0;
    do {
      piVar2[(ulong)uVar3 + 2] = 0;
      uVar3 = ((uint)piVar2[uVar3] >> 4 & 0xf) + ((uint)piVar2[uVar3] >> 8) + uVar3 + 6;
    } while ((int)uVar3 < iVar1);
  }
  return;
}

Assistant:

void Cof_ManCleanValue( Cof_Man_t * p )  
{
    Cof_Obj_t * pObj;
    int i;
    Cof_ManForEachObj( p, pObj, i )
        pObj->Value = 0;
}